

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

int phosg::stat(char *__file,stat *__buf)

{
  int iVar1;
  char *__file_00;
  cannot_stat_file *this;
  stat *st;
  string *filename_local;
  
  __file_00 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__buf);
  iVar1 = ::stat(__file_00,(stat *)__file);
  if (iVar1 != 0) {
    this = (cannot_stat_file *)__cxa_allocate_exception(0x20);
    cannot_stat_file::cannot_stat_file(this,(string *)__buf);
    __cxa_throw(this,&cannot_stat_file::typeinfo,cannot_stat_file::~cannot_stat_file);
  }
  return (int)__file;
}

Assistant:

struct stat stat(const string& filename) {
  struct stat st;
  if (::stat(filename.c_str(), &st)) {
    throw cannot_stat_file(filename);
  }
  return st;
}